

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Put(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  Aig_Man_t *pAVar7;
  Abc_Ntk_t *pNtkOld;
  Abc_Obj_t *pAVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  int local_e4;
  int i_2;
  Abc_Obj_t *pObj_2;
  int nDigits;
  int i_1;
  Abc_Obj_t *pObj_1;
  char pSuffix [100];
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNoCh;
  int fVerbose;
  int c;
  int fUseBuffs;
  int fFindEnables;
  int fStatusClear;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pMan;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadNtk(pAbc);
  bVar2 = true;
  bVar1 = false;
  fVerbose = 0;
  bVar3 = false;
  Extra_UtilGetoptReset();
LAB_0029c0e6:
  iVar5 = Extra_UtilGetopt(argc,argv,"seovh");
  if (iVar5 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (bVar1) {
        _fFindEnables = Abc_NtkFromMappedGia(pAbc->pGia,1,fVerbose);
      }
      else {
        iVar5 = Gia_ManHasCellMapping(pAbc->pGia);
        if (iVar5 == 0) {
          iVar5 = Gia_ManHasMapping(pAbc->pGia);
          if ((iVar5 == 0) && (pAbc->pGia->pMuxes == (uint *)0x0)) {
            iVar5 = Gia_ManHasDangling(pAbc->pGia);
            if (iVar5 == 0) {
              pAVar7 = Gia_ManToAig(pAbc->pGia,0);
              _fFindEnables = Abc_NtkFromAigPhase(pAVar7);
              pcVar9 = Extra_UtilStrsav(pAVar7->pName);
              _fFindEnables->pName = pcVar9;
              Aig_ManStop(pAVar7);
            }
            else {
              pAVar7 = Gia_ManToAig(pAbc->pGia,0);
              pNtkOld = Abc_NtkFromAigPhase(pAVar7);
              pcVar9 = Extra_UtilStrsav(pAVar7->pName);
              pNtkOld->pName = pcVar9;
              Aig_ManStop(pAVar7);
              pAVar7 = Gia_ManToAig(pAbc->pGia,1);
              _fFindEnables = Abc_NtkFromDarChoices(pNtkOld,pAVar7);
              Abc_NtkDelete(pNtkOld);
              Aig_ManStop(pAVar7);
            }
          }
          else {
            _fFindEnables = Abc_NtkFromMappedGia(pAbc->pGia,0,fVerbose);
          }
        }
        else {
          _fFindEnables = Abc_NtkFromCellMappedGia(pAbc->pGia,fVerbose);
        }
      }
      if (pAbc->pGia->vNamesIn != (Vec_Ptr_t *)0x0) {
        pSuffix[0x5c] = '\0';
        pSuffix[0x5d] = '\0';
        pSuffix[0x5e] = '\0';
        pSuffix[0x5f] = '\0';
        for (; uVar4 = pSuffix._92_4_, iVar5 = Abc_NtkCiNum(_fFindEnables), (int)uVar4 < iVar5;
            pSuffix._92_4_ = pSuffix._92_4_ + 1) {
          register0x00000000 = Abc_NtkCi(_fFindEnables,pSuffix._92_4_);
          uVar4 = pSuffix._92_4_;
          iVar5 = Vec_PtrSize(pAbc->pGia->vNamesIn);
          if ((int)uVar4 < iVar5) {
            Nm_ManDeleteIdName(_fFindEnables->pManName,stack0xffffffffffffffa0->Id);
            pAVar8 = stack0xffffffffffffffa0;
            pcVar9 = (char *)Vec_PtrEntry(pAbc->pGia->vNamesIn,pSuffix._92_4_);
            Abc_ObjAssignName(pAVar8,pcVar9,(char *)0x0);
          }
        }
      }
      if (pAbc->pGia->vNamesOut != (Vec_Ptr_t *)0x0) {
        uVar6 = Abc_NtkLatchNum(_fFindEnables);
        uVar6 = Abc_Base10Log(uVar6);
        for (pObj_2._4_4_ = 0; iVar5 = Abc_NtkCoNum(_fFindEnables), pObj_2._4_4_ < iVar5;
            pObj_2._4_4_ = pObj_2._4_4_ + 1) {
          pAVar8 = Abc_NtkCo(_fFindEnables,pObj_2._4_4_);
          iVar5 = Vec_PtrSize(pAbc->pGia->vNamesOut);
          if (pObj_2._4_4_ < iVar5) {
            Nm_ManDeleteIdName(_fFindEnables->pManName,pAVar8->Id);
            iVar5 = Abc_ObjIsPo(pAVar8);
            if (iVar5 == 0) {
              iVar5 = Abc_NtkPoNum(_fFindEnables);
              if (pObj_2._4_4_ < iVar5) {
                __assert_fail("i >= Abc_NtkPoNum(pNtk)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                              ,0x7703,"int Abc_CommandAbc9Put(Abc_Frame_t *, int, char **)");
              }
              iVar5 = Abc_NtkPoNum(_fFindEnables);
              sprintf((char *)&pObj_1,"_li%0*d",(ulong)uVar6,(ulong)(uint)(pObj_2._4_4_ - iVar5));
              pcVar9 = (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut,pObj_2._4_4_);
              Abc_ObjAssignName(pAVar8,pcVar9,(char *)&pObj_1);
            }
            else {
              pcVar9 = (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut,pObj_2._4_4_);
              Abc_ObjAssignName(pAVar8,pcVar9,(char *)0x0);
            }
          }
        }
      }
      if ((pAbc->pGia->vNamesIn != (Vec_Ptr_t *)0x0) || (pAbc->pGia->vNamesOut != (Vec_Ptr_t *)0x0))
      {
        Abc_NtkRedirectCiCo(_fFindEnables);
      }
      if ((pAbc->pGia->vInArrs != (Vec_Flt_t *)0x0) || (pAbc->pGia->vOutReqs != (Vec_Flt_t *)0x0)) {
        Abc_NtkTimeInitialize(_fFindEnables,(Abc_Ntk_t *)0x0);
        Abc_NtkTimeSetDefaultArrival(_fFindEnables,pAbc->pGia->DefInArrs,pAbc->pGia->DefInArrs);
        Abc_NtkTimeSetDefaultRequired(_fFindEnables,pAbc->pGia->DefOutReqs,pAbc->pGia->DefOutReqs);
        if (pAbc->pGia->vInArrs != (Vec_Flt_t *)0x0) {
          for (local_e4 = 0; iVar5 = Abc_NtkCiNum(_fFindEnables), local_e4 < iVar5;
              local_e4 = local_e4 + 1) {
            pAVar8 = Abc_NtkCi(_fFindEnables,local_e4);
            uVar6 = Abc_ObjId(pAVar8);
            fVar10 = Vec_FltEntry(pAbc->pGia->vInArrs,local_e4);
            fVar11 = Vec_FltEntry(pAbc->pGia->vInArrs,local_e4);
            Abc_NtkTimeSetArrival(_fFindEnables,uVar6,fVar10,fVar11);
          }
        }
        if (pAbc->pGia->vOutReqs != (Vec_Flt_t *)0x0) {
          for (local_e4 = 0; iVar5 = Abc_NtkCoNum(_fFindEnables), local_e4 < iVar5;
              local_e4 = local_e4 + 1) {
            pAVar8 = Abc_NtkCo(_fFindEnables,local_e4);
            uVar6 = Abc_ObjId(pAVar8);
            fVar10 = Vec_FltEntry(pAbc->pGia->vOutReqs,local_e4);
            fVar11 = Vec_FltEntry(pAbc->pGia->vOutReqs,local_e4);
            Abc_NtkTimeSetRequired(_fFindEnables,uVar6,fVar10,fVar11);
          }
        }
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,_fFindEnables);
      if (bVar2) {
        Abc_FrameClearVerifStatus(pAbc);
      }
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar5) {
  case 0x65:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0029c0e6;
  default:
    break;
  case 0x68:
    break;
  case 0x6f:
    fVerbose = fVerbose ^ 1;
    goto LAB_0029c0e6;
  case 0x73:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0029c0e6;
  case 0x76:
    goto switchD_0029c12a_caseD_76;
  }
  Abc_Print(-2,"usage: &put [-seovh]\n");
  Abc_Print(-2,"\t         transfer the current network into the old ABC\n");
  pcVar9 = "no";
  if (bVar2) {
    pcVar9 = "yes";
  }
  Abc_Print(-2,"\t-s     : toggle clearning verification status [default = %s]\n",pcVar9);
  pcVar9 = "no";
  if (bVar1) {
    pcVar9 = "yes";
  }
  Abc_Print(-2,"\t-e     : toggle extracting MUXes for flop enables [default = %s]\n",pcVar9);
  pcVar9 = "no";
  if (fVerbose != 0) {
    pcVar9 = "yes";
  }
  Abc_Print(-2,"\t-o     : toggles using buffers to decouple combinational outputs [default = %s]\n"
            ,pcVar9);
  pcVar9 = "no";
  if (bVar3) {
    pcVar9 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar9);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_0029c12a_caseD_76:
  bVar3 = (bool)(bVar3 ^ 1);
  goto LAB_0029c0e6;
}

Assistant:

int Abc_CommandAbc9Put( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkFromDarChoices( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan );
    extern void Abc_NtkRedirectCiCo( Abc_Ntk_t * pNtk );
    extern Abc_Ntk_t * Abc_NtkFromCellMappedGia( Gia_Man_t * p, int fUseBuffs );
    extern Abc_Ntk_t * Abc_NtkFromMappedGia( Gia_Man_t * p, int fFindEnables, int fUseBuffs );

    Aig_Man_t * pMan;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int fStatusClear = 1;
    int fFindEnables = 0;
    int fUseBuffs    = 0;
    int c, fVerbose  = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "seovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fStatusClear ^= 1;
            break;
        case 'e':
            fFindEnables ^= 1;
            break;
        case 'o':
            fUseBuffs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fFindEnables )
        pNtk = Abc_NtkFromMappedGia( pAbc->pGia, 1, fUseBuffs );
    else if ( Gia_ManHasCellMapping(pAbc->pGia) )
        pNtk = Abc_NtkFromCellMappedGia( pAbc->pGia, fUseBuffs );
    else if ( Gia_ManHasMapping(pAbc->pGia) || pAbc->pGia->pMuxes )
        pNtk = Abc_NtkFromMappedGia( pAbc->pGia, 0, fUseBuffs );
    else if ( Gia_ManHasDangling(pAbc->pGia) == 0 )
    {
        pMan = Gia_ManToAig( pAbc->pGia, 0 );
        pNtk = Abc_NtkFromAigPhase( pMan );
        pNtk->pName = Extra_UtilStrsav(pMan->pName);
        Aig_ManStop( pMan );
    }
    else
    {
        Abc_Ntk_t * pNtkNoCh;
//        Abc_Print( -1, "Transforming AIG with %d choice nodes.\n", Gia_ManEquivCountClasses(pAbc->pGia) );
        // create network without choices
        pMan = Gia_ManToAig( pAbc->pGia, 0 );
        pNtkNoCh = Abc_NtkFromAigPhase( pMan );
        pNtkNoCh->pName = Extra_UtilStrsav(pMan->pName);
        Aig_ManStop( pMan );
        // derive network with choices
        pMan = Gia_ManToAig( pAbc->pGia, 1 );
        pNtk = Abc_NtkFromDarChoices( pNtkNoCh, pMan );
        Abc_NtkDelete( pNtkNoCh );
        Aig_ManStop( pMan );
    }
    // transfer PI names to pNtk
    if ( pAbc->pGia->vNamesIn )
    {
        Abc_Obj_t * pObj;
        int i;
        Abc_NtkForEachCi( pNtk, pObj, i ) {
            if (i < Vec_PtrSize(pAbc->pGia->vNamesIn)) {
                Nm_ManDeleteIdName(pNtk->pManName, pObj->Id);
                Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesIn, i), NULL );
            }
        }
    }
    // transfer PO names to pNtk
    if ( pAbc->pGia->vNamesOut )
    {
        char pSuffix[100];
        Abc_Obj_t * pObj;
        int i, nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i ) {
            if (i < Vec_PtrSize(pAbc->pGia->vNamesOut)) {
                Nm_ManDeleteIdName(pNtk->pManName, pObj->Id);
                if ( Abc_ObjIsPo(pObj) )
                    Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut, i), NULL );
                else
                {
                    assert( i >= Abc_NtkPoNum(pNtk) );
                    sprintf( pSuffix, "_li%0*d", nDigits, i-Abc_NtkPoNum(pNtk) );
                    Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut, i), pSuffix );
                }
            }
        }
    }

    // decouple CI/CO with the same name
    if ( pAbc->pGia->vNamesIn || pAbc->pGia->vNamesOut )
        Abc_NtkRedirectCiCo( pNtk );

    // transfer timing information
    if ( pAbc->pGia->vInArrs || pAbc->pGia->vOutReqs )
    {
        Abc_Obj_t * pObj; int i;
        Abc_NtkTimeInitialize( pNtk, NULL );
        Abc_NtkTimeSetDefaultArrival( pNtk, pAbc->pGia->DefInArrs, pAbc->pGia->DefInArrs );
        Abc_NtkTimeSetDefaultRequired( pNtk, pAbc->pGia->DefOutReqs, pAbc->pGia->DefOutReqs );
        if ( pAbc->pGia->vInArrs )
            Abc_NtkForEachCi( pNtk, pObj, i )
                Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), Vec_FltEntry(pAbc->pGia->vInArrs, i), Vec_FltEntry(pAbc->pGia->vInArrs, i) );
        if ( pAbc->pGia->vOutReqs )
            Abc_NtkForEachCo( pNtk, pObj, i )
                Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), Vec_FltEntry(pAbc->pGia->vOutReqs, i), Vec_FltEntry(pAbc->pGia->vOutReqs, i) );
    }

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    if ( fStatusClear )
        Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    Abc_Print( -2, "usage: &put [-seovh]\n" );
    Abc_Print( -2, "\t         transfer the current network into the old ABC\n" );
    Abc_Print( -2, "\t-s     : toggle clearning verification status [default = %s]\n", fStatusClear? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle extracting MUXes for flop enables [default = %s]\n", fFindEnables? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggles using buffers to decouple combinational outputs [default = %s]\n", fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}